

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O3

void ex_print(ex_ex *eptr)

{
  ex_ex *peVar1;
  char *pcVar2;
  ex_ex *peVar3;
  undefined8 uVar4;
  fts_symbol_t s;
  char *fmt;
  bool bVar5;
  
  pcVar2 = (char *)eptr->ex_type;
  peVar1 = eptr->ex_end;
  if (peVar1 != eptr && pcVar2 != (char *)0x0) {
    peVar3 = eptr + 1;
    do {
      switch(pcVar2) {
      case (char *)0x1:
        pcVar2 = (char *)peVar3[-1].ex_cont.v_int;
        fmt = "%ld ";
        break;
      case (char *)0x2:
        post("%f ",(double)peVar3[-1].ex_cont.v_flt);
        goto LAB_00190d3a;
      case (char *)0x3:
        pcVar2 = (char *)peVar3[-1].ex_cont.v_int;
        if (0xb000d < (long)pcVar2) {
          if ((long)pcVar2 < 0xe0015) {
            if ((long)pcVar2 < 0xc0011) {
              if (pcVar2 == (char *)0xb000e) {
                fmt = "%s";
                pcVar2 = ">>";
              }
              else {
                if (pcVar2 != (char *)0xb000f) {
                  if (pcVar2 == (char *)0xc0010) goto LAB_00190f6a;
                  goto switchD_00190de5_default;
                }
                fmt = "%s";
                pcVar2 = "<<";
              }
              break;
            }
            if ((long)pcVar2 < 0xd0013) {
              if (pcVar2 == (char *)0xc0011) {
                pcVar2 = "%c";
                uVar4 = 0x2b;
              }
              else {
                if (pcVar2 != (char *)0xd0012) goto switchD_00190de5_default;
                pcVar2 = "%c";
                uVar4 = 0x25;
              }
            }
            else if (pcVar2 == (char *)0xd0013) {
              pcVar2 = "%c";
              uVar4 = 0x2f;
            }
            else {
              if (pcVar2 != (char *)0xd0014) goto switchD_00190de5_default;
              pcVar2 = "%c";
              uVar4 = 0x2a;
            }
          }
          else if ((long)pcVar2 < 0xf0018) {
            if (pcVar2 == (char *)0xe0015) {
LAB_00190f6a:
              pcVar2 = "%c";
              uVar4 = 0x2d;
            }
            else if (pcVar2 == (char *)0xe0016) {
              pcVar2 = "%c";
              uVar4 = 0x7e;
            }
            else {
              if (pcVar2 != (char *)0xe0017) goto switchD_00190de5_default;
              pcVar2 = "%c";
              uVar4 = 0x21;
            }
          }
          else {
            switch(pcVar2) {
            case (char *)0xf0018:
              pcVar2 = "%c ";
              uVar4 = 0x5d;
              break;
            case (char *)0xf0019:
              goto switchD_00190bc8_caseD_a;
            case (char *)0xf001a:
              pcVar2 = "%c ";
              uVar4 = 0x29;
              break;
            case (char *)0xf001b:
              goto switchD_00190bc8_caseD_9;
            default:
              goto switchD_00190de5_default;
            }
          }
          goto LAB_00190e48;
        }
        if ((long)pcVar2 < 0x80007) {
          if ((long)pcVar2 < 0x40003) {
            if (pcVar2 == (char *)0x10001) {
              pcVar2 = "%c";
              uVar4 = 0x3b;
            }
            else {
              if (pcVar2 != (char *)0x20002) {
                if (pcVar2 != (char *)0x3001c) goto switchD_00190de5_default;
                fmt = "%s";
                pcVar2 = "=";
                break;
              }
              pcVar2 = "%c";
              uVar4 = 0x2c;
            }
          }
          else {
            if ((long)pcVar2 < 0x60005) {
              if (pcVar2 == (char *)0x40003) {
                fmt = "%s";
                pcVar2 = "||";
              }
              else {
                if (pcVar2 != (char *)0x50004) goto switchD_00190de5_default;
                fmt = "%s";
                pcVar2 = "&&";
              }
              break;
            }
            if (pcVar2 == (char *)0x60005) {
              pcVar2 = "%c";
              uVar4 = 0x7c;
            }
            else {
              if (pcVar2 != (char *)0x70006) goto switchD_00190de5_default;
              uVar4 = 0x5e;
              pcVar2 = "%c";
            }
          }
          goto LAB_00190e48;
        }
        if ((long)pcVar2 < 0xa000a) {
          if (pcVar2 == (char *)0x80007) {
            pcVar2 = "%c";
            uVar4 = 0x26;
            goto LAB_00190e48;
          }
          if (pcVar2 == (char *)0x90008) {
            fmt = "%s";
            pcVar2 = "!=";
          }
          else {
            if (pcVar2 != (char *)0x90009) goto switchD_00190de5_default;
            fmt = "%s";
            pcVar2 = "==";
          }
          break;
        }
        switch(pcVar2) {
        case (char *)0xa000a:
          fmt = "%s";
          pcVar2 = ">=";
          break;
        case (char *)0xa000b:
          pcVar2 = "%c";
          uVar4 = 0x3e;
          goto LAB_00190e48;
        case (char *)0xa000c:
          fmt = "%s";
          pcVar2 = "<=";
          break;
        case (char *)0xa000d:
          pcVar2 = "%c";
          uVar4 = 0x3c;
          goto LAB_00190e48;
        default:
switchD_00190de5_default:
          fmt = "expr: ex_print: bad op 0x%lx\n";
        }
        break;
      case (char *)0x4:
        pcVar2 = (char *)peVar3[-1].ex_cont.v_int;
        goto LAB_00190c96;
      case (char *)0x5:
        s = (fts_symbol_t)peVar3[-1].ex_cont.v_vec;
        if (s != (fts_symbol_t)0x0) goto LAB_00190c82;
        pcVar2 = "$$";
        fmt = "%s ";
        break;
      case (char *)0x6:
        pcVar2 = *(char **)peVar3[-1].ex_cont.v_vec;
LAB_00190c96:
        fmt = "%s ";
        break;
      case (char *)0x7:
        pcVar2 = ex_symname((fts_symbol_t)peVar3[-1].ex_cont.v_vec);
        fmt = "\"%s\" ";
        break;
      case (char *)0x8:
        pcVar2 = (char *)(peVar3[-1].ex_cont.v_int + 1);
        fmt = "\"$s%ld\" ";
        break;
      case (char *)0x9:
switchD_00190bc8_caseD_9:
        uVar4 = 0x28;
        pcVar2 = "%c";
        goto LAB_00190e48;
      case (char *)0xa:
switchD_00190bc8_caseD_a:
        uVar4 = 0x5b;
        pcVar2 = "%c";
LAB_00190e48:
        post(pcVar2,uVar4);
        goto LAB_00190d3a;
      case (char *)0xb:
        pcVar2 = (char *)(peVar3[-1].ex_cont.v_int + 1);
        fmt = "$i%ld ";
        break;
      case (char *)0xc:
        pcVar2 = (char *)(peVar3[-1].ex_cont.v_int + 1);
        fmt = "$f%ld ";
        break;
      case (char *)0xd:
        pcVar2 = (char *)peVar3[-1].ex_cont.v_int;
        fmt = "$s%lx ";
        break;
      case (char *)0xe:
        pcVar2 = (char *)peVar3[-1].ex_cont.v_int;
        fmt = "$v%lx ";
        break;
      case (char *)0xf:
        pcVar2 = (char *)peVar3[-1].ex_cont.v_int;
        fmt = "vec = %ld ";
        break;
      case (char *)0x10:
      case (char *)0x11:
        pcVar2 = (char *)(peVar3[-1].ex_cont.v_int + 1);
        fmt = "$y%d";
        break;
      case (char *)0x12:
      case (char *)0x14:
        pcVar2 = (char *)(peVar3[-1].ex_cont.v_int + 1);
        fmt = "$x%d";
        break;
      default:
        fmt = "expr: ex_print: bad type 0x%lx\n";
        break;
      case (char *)0x15:
        s = (fts_symbol_t)peVar3[-1].ex_cont.v_vec;
LAB_00190c82:
        pcVar2 = ex_symname(s);
        fmt = "%s ";
      }
      post(fmt,pcVar2);
LAB_00190d3a:
      pcVar2 = (char *)peVar3->ex_type;
    } while ((pcVar2 != (char *)0x0) && (bVar5 = peVar3 != peVar1, peVar3 = peVar3 + 1, bVar5));
  }
  post("\n");
  return;
}

Assistant:

void
ex_print(struct ex_ex *eptr)
{
                struct ex_ex *extmp;

                extmp = eptr->ex_end;
        while (eptr->ex_type && eptr != extmp) {
                switch (eptr->ex_type) {
                case ET_INT:
                        post("%ld ", eptr->ex_int);
                        break;
                case ET_FLT:
                        post("%f ", eptr->ex_flt);
                        break;
                case ET_STR:
                        post("%s ", eptr->ex_ptr);
                        break;
                case ET_TBL:
                        if (!eptr->ex_ptr) { /* special case of $# processing */
                                post("%s ", "$$");
                            break;
                        }
                            /* falls through */
                case ET_VAR:
                        post("%s ", ex_symname((fts_symbol_t )eptr->ex_ptr));
                        break;
                case ET_SYM:
                        post("\"%s\" ", ex_symname((fts_symbol_t )eptr->ex_ptr));
                        break;
                case ET_VSYM:
                        post("\"$s%ld\" ", eptr->ex_int + 1);
                        break;
                case ET_FUNC:
                        post("%s ",
                            ((t_ex_func *)eptr->ex_ptr)->f_name);
                        break;
                case ET_LP:
                        post("%c", '(');
                        break;
                        /* CHANGE
                 case ET_RP:
                         post("%c ", ')');
                         break;
                         */
                case ET_LB:
                        post("%c", '[');
                        break;
                        /* CHANGE
                case ET_RB:
                         post("%c ", ']');
                         break;
                         */
                case ET_II:
                        post("$i%ld ", eptr->ex_int + 1);
                        break;
                case ET_FI:
                        post("$f%ld ", eptr->ex_int + 1);
                        break;
                case ET_SI:
                        post("$s%lx ", eptr->ex_ptr);
                        break;
                case ET_VI:
                        post("$v%lx ", eptr->ex_vec);
                        break;
                case ET_VEC:
                        post("vec = %ld ", eptr->ex_vec);
                        break;
                case ET_YOM1:
                case ET_YO:
                        post("$y%d", eptr->ex_int + 1);
                        break;
                case ET_XI:
                case ET_XI0:
                        post("$x%d", eptr->ex_int + 1);
                        break;
                case ET_OP:
                        switch (eptr->ex_op) {
                        case OP_LP:
                                post("%c", '(');
                                break;
                        case OP_RP:
                                post("%c ", ')');
                                break;
                        case OP_LB:
                                post("%c", '[');
                                break;
                        case OP_RB:
                                post("%c ", ']');
                                break;
                        case OP_NOT:
                                post("%c", '!');
                                break;
                        case OP_NEG:
                                post("%c", '~');
                                break;
                        case OP_UMINUS:
                                post("%c", '-');
                                break;
                        case OP_MUL:
                                post("%c", '*');
                                break;
                        case OP_DIV:
                                post("%c", '/');
                                break;
                        case OP_MOD:
                                post("%c", '%');
                                break;
                        case OP_ADD:
                                post("%c", '+');
                                break;
                        case OP_SUB:
                                post("%c", '-');
                                break;
                        case OP_SL:
                                post("%s", "<<");
                                break;
                        case OP_SR:
                                post("%s", ">>");
                                break;
                        case OP_LT:
                                post("%c", '<');
                                break;
                        case OP_LE:
                                post("%s", "<=");
                                break;
                        case OP_GT:
                                post("%c", '>');
                                break;
                        case OP_GE:
                                post("%s", ">=");
                                break;
                        case OP_EQ:
                                post("%s", "==");
                                break;
                        case OP_STORE:
                                post("%s", "=");
                                break;
                        case OP_NE:
                                post("%s", "!=");
                                break;
                        case OP_AND:
                                post("%c", '&');
                                break;
                        case OP_XOR:
                                post("%c", '^');
                                break;
                        case OP_OR:
                                post("%c", '|');
                                break;
                        case OP_LAND:
                                post("%s", "&&");
                                break;
                        case OP_LOR:
                                post("%s", "||");
                                break;
                        case OP_COMMA:
                                post("%c", ',');
                                break;
                        case OP_SEMI:
                                post("%c", ';');
                                break;
                        default:
                                post("expr: ex_print: bad op 0x%lx\n", eptr->ex_op);
                        }
                        break;
                default:
                        post("expr: ex_print: bad type 0x%lx\n", eptr->ex_type);
                }
                eptr++;
        }
        post("\n");
}